

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDynamicHeap.cpp
# Opt level: O3

void __thiscall Diligent::VulkanDynamicMemoryManager::Destroy(VulkanDynamicMemoryManager *this)

{
  if ((this->m_VkBuffer).m_VkObject != (VkBuffer_T *)0x0) {
    VulkanUtilities::VulkanLogicalDevice::UnmapMemory
              ((this->m_DeviceVk->m_LogicalVkDevice).
               super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,(this->m_BufferMemory).m_VkObject);
    RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
    ::
    SafeReleaseDeviceObject<VulkanUtilities::VulkanObjectWrapper<VkBuffer_T*,(VulkanUtilities::VulkanHandleTypeId)2>,void>
              ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
                *)this->m_DeviceVk,&this->m_VkBuffer,this->m_CommandQueueMask);
    RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
    ::
    SafeReleaseDeviceObject<VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T*,(VulkanUtilities::VulkanHandleTypeId)6>,void>
              ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
                *)this->m_DeviceVk,&this->m_BufferMemory,this->m_CommandQueueMask);
  }
  this->m_CPUAddress = (Uint8 *)0x0;
  return;
}

Assistant:

void VulkanDynamicMemoryManager::Destroy()
{
    if (m_VkBuffer)
    {
        m_DeviceVk.GetLogicalDevice().UnmapMemory(m_BufferMemory);
        m_DeviceVk.SafeReleaseDeviceObject(std::move(m_VkBuffer), m_CommandQueueMask);
        m_DeviceVk.SafeReleaseDeviceObject(std::move(m_BufferMemory), m_CommandQueueMask);
    }
    m_CPUAddress = nullptr;
}